

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void print_range_internal(char *pre,int ndim,int *lo,int *hi,char *post)

{
  uint uVar1;
  ulong uVar2;
  
  printf("%s[",pre);
  uVar1 = ndim;
  if (ndim < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    printf("%d:%d",(ulong)(uint)lo[uVar2],(ulong)(uint)hi[uVar2]);
    if (ndim - 1 == uVar2) {
      printf("] %s",post);
    }
    else {
      putchar(0x2c);
    }
  }
  return;
}

Assistant:

void print_range_internal(char *pre,int ndim, int lo[], int hi[], char* post)
{
    int i;

    printf("%s[",pre);
    for(i=0;i<ndim;i++){
        printf("%d:%d",lo[i],hi[i]);
        if(i==ndim-1)printf("] %s",post);
        else printf(",");
    }
}